

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_layer.cpp
# Opt level: O3

ON_SectionStyle * __thiscall
ON_Layer::CustomSectionStyle(ON_Layer *this,ON_SectionStyle *sectionStyle)

{
  ON_SectionStyle *other;
  
  if (this->m_private == (ON_LayerPrivate *)0x0) {
    other = (ON_SectionStyle *)0x0;
  }
  else {
    other = (this->m_private->m_custom_section_style).
            super___shared_ptr<ON_SectionStyle,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (other != (ON_SectionStyle *)0x0 && sectionStyle != (ON_SectionStyle *)0x0) {
      ON_SectionStyle::operator=(sectionStyle,other);
    }
  }
  return other;
}

Assistant:

const ON_SectionStyle* ON_Layer::CustomSectionStyle(ON_SectionStyle* sectionStyle) const
{
  const ON_SectionStyle* rc = nullptr;
  if (m_private)
    rc = m_private->m_custom_section_style.get();

  if (sectionStyle && rc)
  {
    *sectionStyle = *rc;
  }

  return rc;
}